

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

avector<Vec3fa> * __thiscall
embree::XMLLoader::loadVec3faArray
          (avector<Vec3fa> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  int iVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar4;
  runtime_error *this_01;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  float fVar11;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> temp;
  string local_a0;
  size_t *local_80;
  string local_78;
  float local_58;
  float local_48;
  
  this_00 = xml->ptr;
  if (this_00 == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (Vec3fa *)0x0;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ofs","");
    XML::parm(&local_a0,this_00,&local_78);
    iVar3 = std::__cxx11::string::compare((char *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (iVar3 == 0) {
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      local_80 = &__return_storage_ptr__->size_active;
      lVar8 = (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar6 = lVar8 * -0x71c71c71c71c71c7;
      if (0x5555555555555555 < (ulong)(lVar8 * -0x7b425ed097b425ed)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_78,&xml->ptr->loc);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_a0._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_a0._M_dataplus._M_p == psVar7) {
          local_a0.field_2._M_allocated_capacity = *psVar7;
          local_a0.field_2._8_8_ = plVar5[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar7;
        }
        local_a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_a0);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar10 = uVar6 / 3;
      if (uVar6 < 3) {
        *local_80 = uVar10;
      }
      else {
        paVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)alignedMalloc(uVar10 << 4,0x10);
        __return_storage_ptr__->items = (Vec3fa *)paVar4;
        alignedFree((void *)0x0);
        __return_storage_ptr__->size_active = uVar10;
        __return_storage_ptr__->size_alloced = uVar10;
        lVar8 = 0x90;
        do {
          local_48 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-2].ty +
                                           lVar8),true);
          local_58 = Token::Float((Token *)((long)&(xml->ptr->body).
                                                                                                      
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].ty +
                                           lVar8),true);
          fVar11 = Token::Float((Token *)((long)&((xml->ptr->body).
                                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->ty +
                                         lVar8),true);
          aVar1.m128[1] = local_58;
          aVar1.m128[0] = local_48;
          aVar1.m128[2] = fVar11;
          aVar1.m128[3] = 0.0;
          *paVar4 = aVar1;
          lVar8 = lVar8 + 0xd8;
          paVar4 = paVar4 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
    else {
      loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
                ((vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *)&local_a0,
                 this,xml);
      __return_storage_ptr__->size_active = 0;
      __return_storage_ptr__->size_alloced = 0;
      __return_storage_ptr__->items = (Vec3fa *)0x0;
      lVar8 = (long)(local_a0._M_string_length - (long)local_a0._M_dataplus._M_p) >> 2;
      sVar9 = lVar8 * -0x5555555555555555;
      if ((pointer)local_a0._M_string_length == local_a0._M_dataplus._M_p) {
        __return_storage_ptr__->size_active = sVar9;
        paVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x0;
      }
      else {
        paVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                 alignedMalloc(lVar8 * -0x5555555555555550,0x10);
        __return_storage_ptr__->items = (Vec3fa *)paVar4;
        alignedFree((void *)0x0);
        __return_storage_ptr__->size_active = sVar9;
        __return_storage_ptr__->size_alloced = sVar9;
      }
      if ((pointer)local_a0._M_string_length != local_a0._M_dataplus._M_p) {
        lVar8 = 4;
        uVar6 = 0;
        do {
          aVar2.m128[1] = (float)(int)*(undefined8 *)(local_a0._M_dataplus._M_p + lVar8);
          aVar2.m128[0] = (float)*(undefined4 *)(local_a0._M_dataplus._M_p + lVar8 + -4);
          aVar2.m128[2] =
               (float)(int)((ulong)*(undefined8 *)(local_a0._M_dataplus._M_p + lVar8) >> 0x20);
          aVar2.m128[3] = 0.0;
          *paVar4 = aVar2;
          uVar6 = uVar6 + 1;
          paVar4 = paVar4 + 1;
          lVar8 = lVar8 + 0xc;
        } while (uVar6 < (ulong)(((long)(local_a0._M_string_length - (long)local_a0._M_dataplus._M_p
                                        ) >> 2) * -0x5555555555555555));
      }
      if (local_a0._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

avector<Vec3fa> XMLLoader::loadVec3faArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3fa>();

    if (xml->parm("ofs") != "") {
      std::vector<Vec3f> temp = loadBinary<std::vector<Vec3f>>(xml);
      avector<Vec3fa> data; data.resize(temp.size());
      for (size_t i=0; i<temp.size(); i++) data[i] = Vec3fa(temp[i]);
      return data;
    } 
    else 
    {
      avector<Vec3fa> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3fa(xml->body[3*i+0].Float(),xml->body[3*i+1].Float(),xml->body[3*i+2].Float());
      return data;
    }
  }